

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

string * __thiscall
testing::internal::
DefaultParamName<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase*(*)()>
          (string *__return_storage_ptr__,internal *this,
          TestParamInfo<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>
          *info)

{
  bool bVar1;
  char cVar2;
  string *extraout_RAX;
  internal *piVar3;
  char cVar4;
  
  cVar4 = '\x01';
  if ((internal *)&DAT_00000009 < this) {
    piVar3 = this;
    cVar2 = '\x04';
    do {
      cVar4 = cVar2;
      if (piVar3 < (internal *)&DAT_00000064) {
        cVar4 = cVar4 + -2;
        goto LAB_0055ee09;
      }
      if (piVar3 < (internal *)0x3e8) {
        cVar4 = cVar4 + -1;
        goto LAB_0055ee09;
      }
      if (piVar3 < (internal *)0x2710) goto LAB_0055ee09;
      bVar1 = (internal *)0x1869f < piVar3;
      piVar3 = (internal *)((ulong)piVar3 / 10000);
      cVar2 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_0055ee09:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((__return_storage_ptr__->_M_dataplus)._M_p,
             (uint)__return_storage_ptr__->_M_string_length,(unsigned_long)this);
  return extraout_RAX;
}

Assistant:

std::string DefaultParamName(const TestParamInfo<ParamType>& info) {
  return std::to_string(info.index);
}